

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhistory.cc
# Opt level: O2

void __thiscall
bdHistory::addMsg(bdHistory *this,bdId *id,bdToken *param_2,uint32_t msgType,bool incoming,
                 bdNodeId *aboutId)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  in_port_t iVar4;
  in_addr iVar5;
  time_t ts;
  mapped_type *this_00;
  MsgRegister local_b8;
  pair<long,_MsgRegister> local_78;
  
  ts = time((time_t *)0x0);
  this_00 = std::
            map<bdId,_bdMsgHistoryList,_std::less<bdId>,_std::allocator<std::pair<const_bdId,_bdMsgHistoryList>_>_>
            ::operator[](&this->mHistory,id);
  iVar4 = (id->addr).sin_port;
  iVar5.s_addr = (id->addr).sin_addr.s_addr;
  uVar1 = *(undefined8 *)(id->addr).sin_zero;
  uVar2 = *(undefined8 *)(id->id).data;
  uVar3 = *(undefined8 *)((id->id).data + 8);
  (this_00->mId).addr.sin_family = (id->addr).sin_family;
  (this_00->mId).addr.sin_port = iVar4;
  (this_00->mId).addr.sin_addr = (in_addr)iVar5.s_addr;
  *(undefined8 *)(this_00->mId).addr.sin_zero = uVar1;
  *(undefined8 *)(this_00->mId).id.data = uVar2;
  *(undefined8 *)((this_00->mId).id.data + 8) = uVar3;
  *(undefined4 *)((this_00->mId).id.data + 0x10) = *(undefined4 *)((id->id).data + 0x10);
  bdMsgHistoryList::addMsg(this_00,ts,msgType,incoming,aboutId);
  MsgRegister::MsgRegister(&local_b8,id,msgType,incoming,aboutId);
  local_78.second.id.addr.sin_family = local_b8.id.addr.sin_family;
  local_78.second.id.addr.sin_port = local_b8.id.addr.sin_port;
  local_78.second.id.addr.sin_addr.s_addr = local_b8.id.addr.sin_addr.s_addr;
  local_78.second.id.addr.sin_zero[0] = local_b8.id.addr.sin_zero[0];
  local_78.second.id.addr.sin_zero[1] = local_b8.id.addr.sin_zero[1];
  local_78.second.id.addr.sin_zero[2] = local_b8.id.addr.sin_zero[2];
  local_78.second.id.addr.sin_zero[3] = local_b8.id.addr.sin_zero[3];
  local_78.second.id.addr.sin_zero[4] = local_b8.id.addr.sin_zero[4];
  local_78.second.id.addr.sin_zero[5] = local_b8.id.addr.sin_zero[5];
  local_78.second.id.addr.sin_zero[6] = local_b8.id.addr.sin_zero[6];
  local_78.second.id.addr.sin_zero[7] = local_b8.id.addr.sin_zero[7];
  local_78.second.id.id.data[0] = local_b8.id.id.data[0];
  local_78.second.id.id.data[1] = local_b8.id.id.data[1];
  local_78.second.id.id.data[2] = local_b8.id.id.data[2];
  local_78.second.id.id.data[3] = local_b8.id.id.data[3];
  local_78.second.id.id.data[4] = local_b8.id.id.data[4];
  local_78.second.id.id.data[5] = local_b8.id.id.data[5];
  local_78.second.id.id.data[6] = local_b8.id.id.data[6];
  local_78.second.id.id.data[7] = local_b8.id.id.data[7];
  local_78.second.id.id.data[8] = local_b8.id.id.data[8];
  local_78.second.id.id.data[9] = local_b8.id.id.data[9];
  local_78.second.id.id.data[10] = local_b8.id.id.data[10];
  local_78.second.id.id.data[0xb] = local_b8.id.id.data[0xb];
  local_78.second.id.id.data[0xc] = local_b8.id.id.data[0xc];
  local_78.second.id.id.data[0xd] = local_b8.id.id.data[0xd];
  local_78.second.id.id.data[0xe] = local_b8.id.id.data[0xe];
  local_78.second.id.id.data[0xf] = local_b8.id.id.data[0xf];
  local_78.second.id.id.data[0x10] = local_b8.id.id.data[0x10];
  local_78.second.id.id.data[0x11] = local_b8.id.id.data[0x11];
  local_78.second.id.id.data[0x12] = local_b8.id.id.data[0x12];
  local_78.second.id.id.data[0x13] = local_b8.id.id.data[0x13];
  local_78.second.msgType = local_b8.msgType;
  local_78.second.incoming = local_b8.incoming;
  local_78.second.aboutId.data[0] = local_b8.aboutId.data[0];
  local_78.second.aboutId.data[1] = local_b8.aboutId.data[1];
  local_78.second.aboutId.data[2] = local_b8.aboutId.data[2];
  local_78.second.aboutId.data[3] = local_b8.aboutId.data[3];
  local_78.second.aboutId.data[4] = local_b8.aboutId.data[4];
  local_78.second.aboutId.data[5] = local_b8.aboutId.data[5];
  local_78.second.aboutId.data[6] = local_b8.aboutId.data[6];
  local_78.second.aboutId.data[7] = local_b8.aboutId.data[7];
  local_78.second.aboutId.data[8] = local_b8.aboutId.data[8];
  local_78.second.aboutId.data[9] = local_b8.aboutId.data[9];
  local_78.second.aboutId.data[10] = local_b8.aboutId.data[10];
  local_78.second.aboutId.data[0xb] = local_b8.aboutId.data[0xb];
  local_78.second.aboutId.data[0xc] = local_b8.aboutId.data[0xc];
  local_78.second.aboutId.data[0xd] = local_b8.aboutId.data[0xd];
  local_78.second.aboutId.data[0xe] = local_b8.aboutId.data[0xe];
  local_78.second.aboutId.data[0xf] = local_b8.aboutId.data[0xf];
  local_78.second.aboutId.data[0x10] = local_b8.aboutId.data[0x10];
  local_78.second.aboutId.data[0x11] = local_b8.aboutId.data[0x11];
  local_78.second.aboutId.data[0x12] = local_b8.aboutId.data[0x12];
  local_78.second.aboutId.data[0x13] = local_b8.aboutId.data[0x13];
  local_78.second._61_3_ = local_b8._61_3_;
  local_78.first = ts;
  std::
  _Rb_tree<long,std::pair<long_const,MsgRegister>,std::_Select1st<std::pair<long_const,MsgRegister>>,std::less<long>,std::allocator<std::pair<long_const,MsgRegister>>>
  ::_M_emplace_equal<std::pair<long,MsgRegister>>
            ((_Rb_tree<long,std::pair<long_const,MsgRegister>,std::_Select1st<std::pair<long_const,MsgRegister>>,std::less<long>,std::allocator<std::pair<long_const,MsgRegister>>>
              *)&this->mMsgTimeline,&local_78);
  return;
}

Assistant:

void bdHistory::addMsg(const bdId *id, bdToken * /*transId*/, uint32_t msgType, bool incoming, const bdNodeId *aboutId) {
	//std::cerr << "bdHistory::addMsg() ";
	//bdStdPrintId(std::cerr, id);
	//std::cerr << std::endl;

	time_t now = time(NULL);

	std::map<bdId, bdMsgHistoryList>::iterator it;
	bdMsgHistoryList &histRef = mHistory[*id]; /* will instaniate empty */
	histRef.mId = *id;
	histRef.addMsg(now, msgType, incoming, aboutId);

	/* add to mMsgTimeline */
	mMsgTimeline.insert(std::make_pair(now, MsgRegister(id, msgType, incoming, aboutId)));
}